

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O3

void event_signal_point(game_event_type type,wchar_t x,wchar_t y)

{
  event_handler_entry *peVar1;
  game_event_data data;
  game_event_data local_48;
  
  local_48.point.x = x;
  local_48.point.y = y;
  for (peVar1 = event_handlers[type]; peVar1 != (event_handler_entry *)0x0; peVar1 = peVar1->next) {
    (*peVar1->fn)(type,&local_48,peVar1->user);
  }
  return;
}

Assistant:

void event_signal_point(game_event_type type, int x, int y)
{
	game_event_data data;
	data.point.x = x;
	data.point.y = y;

	game_event_dispatch(type, &data);
}